

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

uint64_t sum_quotients<unsigned_short,libdivide::divider<unsigned_short,(libdivide::Branching)0>>
                   (random_numerators<unsigned_short> *vals,
                   divider<unsigned_short,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint32_t yl;
  long lVar4;
  uint uVar5;
  uint32_t xl;
  uint uVar6;
  
  uVar2 = (div->div).denom.magic;
  bVar1 = (div->div).denom.more;
  uVar5 = 0;
  for (lVar4 = 0; (ulong)vals->_length * 2 != lVar4; lVar4 = lVar4 + 2) {
    uVar3 = *(ushort *)((long)vals->_pData + lVar4);
    if (uVar2 == 0) {
      uVar6 = (uint)(uVar3 >> (bVar1 & 0x1f));
    }
    else {
      uVar6 = (uint)uVar2 * (uint)uVar3 >> 0x10;
      if ((bVar1 & 0x40) == 0) {
        uVar6 = uVar6 >> (bVar1 & 0x1f);
      }
      else {
        uVar6 = ((uVar3 - uVar6 >> 1) + uVar6 & 0xffff) >> (bVar1 & 0x1f);
      }
    }
    uVar5 = uVar5 + uVar6;
  }
  return (ulong)(uVar5 & 0xffff);
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}